

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O1

void __thiscall QAccessibleWidget::doAction(QAccessibleWidget *this,QString *actionName)

{
  char cVar1;
  long lVar2;
  QWidget *pQVar3;
  long lVar4;
  QWidget *pQVar5;
  QStringView QVar6;
  QStringView QVar7;
  
  lVar2 = (**(code **)(*(long *)this + 0x18))();
  lVar4 = 0;
  if ((*(byte *)(*(long *)(lVar2 + 8) + 0x30) & 1) != 0) {
    lVar4 = lVar2;
  }
  if ((*(byte *)(*(long *)(lVar4 + 0x20) + 8) & 1) == 0) {
    lVar2 = QAccessibleActionInterface::setFocusAction();
    lVar4 = (actionName->d).size;
    if (lVar4 == *(long *)(lVar2 + 0x10)) {
      QVar6.m_data = (actionName->d).ptr;
      QVar6.m_size = lVar4;
      QVar7.m_data = *(storage_type_conflict **)(lVar2 + 8);
      QVar7.m_size = *(long *)(lVar2 + 0x10);
      cVar1 = QtPrivate::equalStrings(QVar6,QVar7);
      if (cVar1 != '\0') {
        lVar2 = (**(code **)(*(long *)this + 0x18))(this);
        lVar4 = 0;
        if ((*(byte *)(*(long *)(lVar2 + 8) + 0x30) & 1) != 0) {
          lVar4 = lVar2;
        }
        if ((*(byte *)(*(long *)(lVar4 + 0x20) + 0xc) & 1) != 0) {
          pQVar3 = (QWidget *)(**(code **)(*(long *)this + 0x18))();
          pQVar5 = (QWidget *)0x0;
          if ((*(byte *)(*(long *)&pQVar3->field_0x8 + 0x30) & 1) != 0) {
            pQVar5 = pQVar3;
          }
          QWidget::activateWindow(pQVar5);
        }
        pQVar3 = (QWidget *)(**(code **)(*(long *)this + 0x18))();
        pQVar5 = (QWidget *)0x0;
        if ((*(byte *)(*(long *)&pQVar3->field_0x8 + 0x30) & 1) != 0) {
          pQVar5 = pQVar3;
        }
        QWidget::setFocus(pQVar5,OtherFocusReason);
        return;
      }
    }
  }
  return;
}

Assistant:

void QAccessibleWidget::doAction(const QString &actionName)
{
    if (!widget()->isEnabled())
        return;

    if (actionName == setFocusAction()) {
        if (widget()->isWindow())
            widget()->activateWindow();
        widget()->setFocus();
    }
}